

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

void xmlBufEmpty(xmlBufPtr buf)

{
  xmlChar *pxVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  uint uVar4;
  ulong uVar5;
  
  if (((buf == (xmlBufPtr)0x0) || (buf->error != 0)) ||
     (pxVar3 = buf->content, pxVar3 == (xmlChar *)0x0)) {
    return;
  }
  uVar2 = (ulong)buf->compat_size;
  uVar5 = buf->size;
  if (buf->size != uVar2 && uVar2 < 0x7fffffff) {
    buf->size = uVar2;
    uVar5 = uVar2;
  }
  buf->use = 0;
  if (buf->alloc == XML_BUFFER_ALLOC_IO) {
    pxVar1 = buf->contentIO;
    if (pxVar1 != (xmlChar *)0x0) {
      buf->size = (size_t)(pxVar3 + (uVar5 - (long)pxVar1));
      buf->content = pxVar1;
      pxVar3 = pxVar1;
    }
LAB_00136358:
    *pxVar3 = '\0';
    uVar5 = 0x7fffffff;
    if (buf->size < 0x7fffffff) {
      uVar5 = buf->size;
    }
    uVar2 = buf->use;
    buf->compat_size = (uint)uVar5;
    uVar4 = 0x7fffffff;
    if (0x7ffffffe < uVar2) goto LAB_00136381;
  }
  else {
    if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) goto LAB_00136358;
    buf->content = "";
    uVar2 = 0x7fffffff;
    if (uVar5 < 0x7fffffff) {
      uVar2 = uVar5;
    }
    buf->compat_size = (uint)uVar2;
    uVar2 = 0;
  }
  uVar4 = (uint)uVar2;
LAB_00136381:
  buf->compat_use = uVar4;
  return;
}

Assistant:

void
xmlBufEmpty(xmlBufPtr buf) {
    if ((buf == NULL) || (buf->error != 0)) return;
    if (buf->content == NULL) return;
    CHECK_COMPAT(buf)
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        buf->content = BAD_CAST "";
    } else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
               (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	buf->size += start_buf;
        buf->content = buf->contentIO;
        buf->content[0] = 0;
    } else {
        buf->content[0] = 0;
    }
    UPDATE_COMPAT(buf)
}